

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::push_at<Search::action_repr>
               (v_array<Search::action_repr> *v,action_repr item,size_t pos)

{
  action_repr *paVar1;
  size_t sVar2;
  action_repr **ppaVar3;
  ulong in_RCX;
  features *in_RDX;
  undefined4 in_ESI;
  v_array<Search::action_repr> *in_RDI;
  size_t in_stack_000001a8;
  v_array<Search::action_repr> *in_stack_000001b0;
  undefined4 uStack_c;
  
  sVar2 = v_array<Search::action_repr>::size(in_RDI);
  if (in_RCX < sVar2) {
    ppaVar3 = v_array<Search::action_repr>::begin(in_RDI);
    paVar1 = *ppaVar3;
    *(ulong *)(paVar1 + in_RCX) = CONCAT44(uStack_c,in_ESI);
    paVar1[in_RCX].repr = in_RDX;
  }
  else {
    paVar1 = in_RDI->end_array;
    ppaVar3 = v_array<Search::action_repr>::begin(in_RDI);
    if (*ppaVar3 + in_RCX < paVar1) {
      ppaVar3 = v_array<Search::action_repr>::end(in_RDI);
      paVar1 = *ppaVar3;
      sVar2 = v_array<Search::action_repr>::size(in_RDI);
      memset(paVar1,0,(in_RCX - sVar2) * 0x10);
      ppaVar3 = v_array<Search::action_repr>::begin(in_RDI);
      paVar1 = *ppaVar3;
      *(ulong *)(paVar1 + in_RCX) = CONCAT44(uStack_c,in_ESI);
      paVar1[in_RCX].repr = in_RDX;
      ppaVar3 = v_array<Search::action_repr>::begin(in_RDI);
      paVar1 = *ppaVar3;
      ppaVar3 = v_array<Search::action_repr>::end(in_RDI);
      *ppaVar3 = paVar1 + in_RCX + 1;
    }
    else {
      v_array<Search::action_repr>::resize(in_stack_000001b0,in_stack_000001a8);
      ppaVar3 = v_array<Search::action_repr>::begin(in_RDI);
      paVar1 = *ppaVar3;
      *(ulong *)(paVar1 + in_RCX) = CONCAT44(uStack_c,in_ESI);
      paVar1[in_RCX].repr = in_RDX;
      ppaVar3 = v_array<Search::action_repr>::begin(in_RDI);
      paVar1 = *ppaVar3;
      ppaVar3 = v_array<Search::action_repr>::end(in_RDI);
      *ppaVar3 = paVar1 + in_RCX + 1;
    }
  }
  return;
}

Assistant:

void push_at(v_array<T>& v, T item, size_t pos)
{
  if (v.size() > pos)
    v.begin()[pos] = item;
  else
  {
    if (v.end_array > v.begin() + pos)
    {
      // there's enough memory, just not enough filler
      memset(v.end(), 0, sizeof(T) * (pos - v.size()));
      v.begin()[pos] = item;
      v.end() = v.begin() + pos + 1;
    }
    else
    {
      // there's not enough memory
      v.resize(2 * pos + 3);
      v.begin()[pos] = item;
      v.end() = v.begin() + pos + 1;
    }
  }
}